

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeSorterRowkey(VdbeCursor *pCsr,Mem *pOut)

{
  int iVar1;
  int local_34;
  void *pvStack_30;
  int nKey;
  void *pKey;
  VdbeSorter *pSorter;
  Mem *pOut_local;
  VdbeCursor *pCsr_local;
  
  pKey = pCsr->pSorter;
  pSorter = (VdbeSorter *)pOut;
  pOut_local = (Mem *)pCsr;
  pvStack_30 = vdbeSorterRowkey((VdbeSorter *)pKey,&local_34);
  iVar1 = sqlite3VdbeMemGrow((Mem *)pSorter,local_34,0);
  if (iVar1 == 0) {
    pSorter->mxPmaSize = local_34;
    *(ushort *)&pSorter->field_0x24 = *(ushort *)&pSorter->field_0x24 & 0xbe00 | 0x10;
    memcpy((void *)pSorter->iReadOff,pvStack_30,(long)local_34);
    pCsr_local._4_4_ = 0;
  }
  else {
    pCsr_local._4_4_ = 7;
  }
  return pCsr_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterRowkey(const VdbeCursor *pCsr, Mem *pOut){
  VdbeSorter *pSorter = pCsr->pSorter;
  void *pKey; int nKey;           /* Sorter key to copy into pOut */

  pKey = vdbeSorterRowkey(pSorter, &nKey);
  if( sqlite3VdbeMemGrow(pOut, nKey, 0) ){
    return SQLITE_NOMEM;
  }
  pOut->n = nKey;
  MemSetTypeFlag(pOut, MEM_Blob);
  memcpy(pOut->z, pKey, nKey);

  return SQLITE_OK;
}